

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TVariable * __thiscall
glslang::HlslParseContext::makeInternalVariable(HlslParseContext *this,char *name,TType *type)

{
  TString *name_00;
  TVariable *this_00;
  TVariable *variable;
  TString *nameString;
  TType *type_local;
  char *name_local;
  HlslParseContext *this_local;
  
  name_00 = NewPoolTString_abi_cxx11_(name);
  this_00 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)name);
  TVariable::TVariable(this_00,name_00,type,false);
  TSymbolTable::makeInternalVariable((this->super_TParseContextBase).symbolTable,(TSymbol *)this_00)
  ;
  return this_00;
}

Assistant:

TVariable* HlslParseContext::makeInternalVariable(const char* name, const TType& type) const
{
    TString* nameString = NewPoolTString(name);
    TVariable* variable = new TVariable(nameString, type);
    symbolTable.makeInternalVariable(*variable);

    return variable;
}